

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver_api.c
# Opt level: O1

void satoko_write_dimacs(satoko_t *s,char *fname,int wrt_lrnt,int zero_var)

{
  char cVar1;
  uint uVar2;
  uint *puVar3;
  uint uVar4;
  ulong uVar5;
  FILE *__stream;
  vec_char_t *pvVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  uint *puVar10;
  char *__format;
  int iVar11;
  ulong uVar12;
  
  if (1 < (uint)wrt_lrnt) {
    __assert_fail("wrt_lrnt == 0 || wrt_lrnt == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/satoko/solver_api.c"
                  ,0x250,"void satoko_write_dimacs(satoko_t *, char *, int, int)");
  }
  if (1 < (uint)zero_var) {
    __assert_fail("zero_var == 0 || zero_var == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/satoko/solver_api.c"
                  ,0x251,"void satoko_write_dimacs(satoko_t *, char *, int, int)");
  }
  uVar8 = s->activity->size;
  uVar7 = s->trail->size;
  uVar2 = s->originals->size;
  uVar4 = s->learnts->size;
  uVar5 = (ulong)uVar4;
  __stream = _stdout;
  if (fname != (char *)0x0) {
    __stream = fopen(fname,"w");
  }
  if (__stream == (FILE *)0x0) {
    puts("Error: Cannot open output file.");
    return;
  }
  if (wrt_lrnt == 0) {
    uVar4 = 0;
  }
  fprintf(__stream,"p cnf %d %d\n",(ulong)uVar8,(ulong)(uVar7 + uVar2 + uVar4));
  pvVar6 = s->assigns;
  if (pvVar6->size != 0) {
    uVar12 = 0;
    uVar9 = 0;
    do {
      cVar1 = pvVar6->data[uVar9];
      iVar11 = (int)uVar12;
      if (cVar1 != '\x03') {
        if (zero_var == 0) {
          if (cVar1 == '\x01') {
            uVar8 = iVar11 - 1;
          }
          else {
            uVar8 = (int)uVar9 + 1;
          }
          uVar12 = (ulong)uVar8;
          __format = "%d 0\n";
        }
        else {
          if (cVar1 != '\x01') {
            uVar12 = uVar9 & 0xffffffff;
          }
          __format = "%d\n";
        }
        fprintf(__stream,__format,uVar12);
      }
      uVar9 = uVar9 + 1;
      pvVar6 = s->assigns;
      uVar12 = (ulong)(iVar11 - 1);
    } while (uVar9 < pvVar6->size);
  }
  if (s->originals == (vec_uint_t *)0x0) {
LAB_00556c39:
    __assert_fail("p",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/satoko/utils/vec/vec_uint.h"
                  ,0x9a,"unsigned int *vec_uint_data(vec_uint_t *)");
  }
  if (s->originals->size != 0) {
    puVar3 = s->originals->data;
    uVar12 = 0;
    do {
      uVar9 = (ulong)puVar3[uVar12];
      if (uVar9 == 0xffffffff) {
        puVar10 = (uint *)0x0;
      }
      else {
        puVar10 = s->all_clauses->data + uVar9;
      }
      if (puVar10[1] != 0) {
        uVar9 = 0;
        do {
          uVar7 = (puVar10[uVar9 + 2] >> 1) + (zero_var ^ 1U);
          uVar8 = -uVar7;
          if ((puVar10[uVar9 + 2] & 1) == 0) {
            uVar8 = uVar7;
          }
          fprintf(__stream,"%d ",(ulong)uVar8);
          uVar9 = uVar9 + 1;
        } while (uVar9 < puVar10[1]);
      }
      if (zero_var == 1) {
        fputc(10,__stream);
      }
      else {
        fwrite("0\n",2,1,__stream);
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 < s->originals->size);
  }
  if (wrt_lrnt != 0) {
    if (s->learnts == (vec_uint_t *)0x0) goto LAB_00556c39;
    if (uVar5 != 0) {
      puVar3 = s->learnts->data;
      uVar12 = 0;
      do {
        uVar9 = (ulong)puVar3[uVar12];
        if (uVar9 == 0xffffffff) {
          puVar10 = (uint *)0x0;
        }
        else {
          puVar10 = s->all_clauses->data + uVar9;
        }
        if (puVar10[1] != 0) {
          uVar9 = 0;
          do {
            uVar7 = (puVar10[uVar9 + 2] >> 1) + (zero_var ^ 1U);
            uVar8 = -uVar7;
            if ((puVar10[uVar9 + 2] & 1) == 0) {
              uVar8 = uVar7;
            }
            fprintf(__stream,"%d ",(ulong)uVar8);
            uVar9 = uVar9 + 1;
          } while (uVar9 < puVar10[1]);
        }
        if (zero_var == 1) {
          fputc(10,__stream);
        }
        else {
          fwrite("0\n",2,1,__stream);
        }
        uVar12 = uVar12 + 1;
      } while (uVar12 != uVar5);
    }
  }
  fclose(__stream);
  return;
}

Assistant:

void satoko_write_dimacs(satoko_t *s, char *fname, int wrt_lrnt, int zero_var)
{
    FILE *file;
    unsigned i;
    unsigned n_vars = vec_act_size(s->activity);
    unsigned n_orig = vec_uint_size(s->originals) + vec_uint_size(s->trail);
    unsigned n_lrnts = vec_uint_size(s->learnts);
    unsigned *array;

    assert(wrt_lrnt == 0 || wrt_lrnt == 1);
    assert(zero_var == 0 || zero_var == 1);
    if (fname != NULL)
        file = fopen(fname, "w");
    else
        file = stdout;
    
    if (file == NULL) {
        printf( "Error: Cannot open output file.\n");
        return;
    }
    fprintf(file, "p cnf %d %d\n", n_vars, wrt_lrnt ? n_orig + n_lrnts : n_orig);
    for (i = 0; i < vec_char_size(s->assigns); i++) {
        if ( var_value(s, i) != SATOKO_VAR_UNASSING ) {
            if (zero_var)
                fprintf(file, "%d\n", var_value(s, i) == SATOKO_LIT_FALSE ? -(int)(i) : i);
            else
                fprintf(file, "%d 0\n", var_value(s, i) == SATOKO_LIT_FALSE ? -(int)(i + 1) : i + 1);
        }
    }
    array = vec_uint_data(s->originals);
    for (i = 0; i < vec_uint_size(s->originals); i++)
        clause_dump(file, clause_fetch(s, array[i]), !zero_var);
    
    if (wrt_lrnt) {
        array = vec_uint_data(s->learnts);
        for (i = 0; i < n_lrnts; i++)
            clause_dump(file, clause_fetch(s, array[i]), !zero_var);
    }
    fclose(file);

}